

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

attr_list cod_ev_get_attrs(cod_exec_context ec,int queue,int index)

{
  undefined8 uVar1;
  queue_item *pqVar2;
  attr_list *pp_Var3;
  uint in_EDX;
  uint in_ESI;
  undefined8 in_RDI;
  CManager unaff_retaddr;
  attr_list *pattr;
  queue_item *item;
  ev_state_data *ev_state;
  int line;
  char *in_stack_fffffffffffffff8;
  attr_list p_Var4;
  
  uVar1 = cod_get_client_data(in_RDI,0x34567890);
  line = (int)((ulong)in_RDI >> 0x20);
  pqVar2 = cod_find_index_rel((ev_state_data *)CONCAT44(in_ESI,in_EDX),(int)((ulong)uVar1 >> 0x20),
                              (int)uVar1);
  if (pqVar2 == (queue_item *)0x0) {
    printf("No item at index %d on queue %d\n",(ulong)in_EDX,(ulong)in_ESI);
    p_Var4 = (attr_list)0x0;
  }
  else {
    pp_Var3 = &pqVar2->item->attrs;
    if (*pp_Var3 == (attr_list)0x0) {
      p_Var4 = CMint_create_attr_list(unaff_retaddr,in_stack_fffffffffffffff8,line);
      *pp_Var3 = p_Var4;
    }
    p_Var4 = *pp_Var3;
  }
  return p_Var4;
}

Assistant:

static attr_list cod_ev_get_attrs(cod_exec_context ec, int queue, int index) {
    struct ev_state_data *ev_state = (void*) cod_get_client_data(ec, 0x34567890);
    queue_item *item = cod_find_index_rel(ev_state, queue, index);
    attr_list *pattr;

    if (NULL == item) {
	printf("No item at index %d on queue %d\n", index, queue);

	return NULL;
    }
    pattr = &item->item->attrs;
    if (!*pattr) {
        *pattr = CMcreate_attr_list(ev_state->cm);
    }
    return *pattr;
}